

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * __thiscall Omega_h::AssignOp::eval(any *__return_storage_ptr__,AssignOp *this,ExprEnv *env)

{
  element_type *peVar1;
  mapped_type *this_00;
  any local_38;
  ExprEnv *local_20;
  ExprEnv *env_local;
  AssignOp *this_local;
  
  local_20 = env;
  env_local = (ExprEnv *)this;
  this_local = (AssignOp *)__return_storage_ptr__;
  peVar1 = std::__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->rhs);
  (*peVar1->_vptr_ExprOp[2])(&local_38,peVar1,local_20);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
            ::operator[](&local_20->variables,&this->name);
  any::operator=(this_00,&local_38);
  any::~any(&local_38);
  any::any(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

any AssignOp::eval(ExprEnv& env) {
  env.variables[name] = rhs->eval(env);
  return any();
}